

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O3

void __thiscall PSVIWriterHandlers::processActualValue(PSVIWriterHandlers *this,PSVIItem *item)

{
  short *psVar1;
  wchar16 *pwVar2;
  int iVar3;
  undefined4 extraout_var;
  XMLFormatter *pXVar4;
  long lVar5;
  XMLCh *pXVar6;
  ArrayJanitor<char16_t> jan;
  char buffer [1024];
  ArrayJanitor<char16_t> aAStack_428 [16];
  char local_418 [1024];
  XSValue *obj;
  
  if (item == (PSVIItem *)0x0) {
    return;
  }
  iVar3 = (*item->_vptr_PSVIItem[4])(item);
  obj = (XSValue *)CONCAT44(extraout_var,iVar3);
  if (obj == (XSValue *)0x0) {
    return;
  }
  pXVar4 = this->fFormatter;
  *(undefined4 *)pXVar4 = 0;
  pXVar4 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar4,this->fIndentChars);
  xercesc_4_0::XMLFormatter::operator<<(pXVar4,L"<!--\n");
  incIndent(this);
  writeOpen(this,L"actualValue");
  incIndent(this);
  switch(*(undefined4 *)obj) {
  case 1:
    writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BOOLEAN);
    pXVar6 = (XMLCh *)((long)&xercesc_4_0::XMLUni::fgBooleanValueSpace +
                      (ulong)(((byte)obj[8] ^ 1) << 4));
    goto LAB_0010fb81;
  case 2:
    writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    sprintf(local_418,"%f",*(undefined8 *)(obj + 8));
    pXVar6 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                (local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)aAStack_428);
    writeValue(this,L"dataValue",pXVar6);
    break;
  case 3:
    writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    sprintf(local_418,"%f",(double)*(float *)(obj + 8));
    pXVar6 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                (local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)aAStack_428);
    writeValue(this,L"dataValue",pXVar6);
    break;
  case 4:
    writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
    sprintf(local_418,"%f",*(undefined8 *)(obj + 8));
    pXVar6 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                (local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)aAStack_428);
    writeValue(this,L"dataValue",pXVar6);
    break;
  case 5:
    pXVar6 = (XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION;
    goto LAB_0010fae8;
  case 6:
    pXVar6 = (XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME;
    goto LAB_0010fae8;
  case 7:
    pXVar6 = (XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TIME;
    goto LAB_0010fae8;
  case 8:
    pXVar6 = (XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE;
    goto LAB_0010fae8;
  case 9:
    pXVar6 = (XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH;
    goto LAB_0010fae8;
  case 10:
    pXVar6 = (XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEAR;
    goto LAB_0010fae8;
  case 0xb:
    pXVar6 = (XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTHDAY;
    goto LAB_0010fae8;
  case 0xc:
    pXVar6 = (XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY;
    goto LAB_0010fae8;
  case 0xd:
    pXVar6 = (XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH;
LAB_0010fae8:
    writeValue(this,L"dataType",pXVar6);
    formDateTime(this,obj);
    goto switchD_0010f52f_caseD_10;
  case 0xe:
    pXVar6 = (XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_HEXBINARY;
    goto LAB_0010fb75;
  case 0xf:
    pXVar6 = (XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY;
LAB_0010fb75:
    writeValue(this,L"dataType",pXVar6);
    pXVar6 = *(XMLCh **)(obj + 8);
LAB_0010fb81:
    writeValue(this,L"dataValue",pXVar6);
  default:
    goto switchD_0010f52f_caseD_10;
  case 0x1f:
    writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
    sprintf(local_418,"%ld",*(undefined8 *)(obj + 8));
    pXVar6 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                (local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)aAStack_428);
    writeValue(this,L"dataValue",pXVar6);
    break;
  case 0x20:
    writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_NONPOSITIVEINTEGER);
    sprintf(local_418,"%ld",*(undefined8 *)(obj + 8));
    pXVar6 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                (local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)aAStack_428);
    writeValue(this,L"dataValue",pXVar6);
    break;
  case 0x21:
    writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_NEGATIVEINTEGER);
    sprintf(local_418,"%ld",*(undefined8 *)(obj + 8));
    pXVar6 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                (local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)aAStack_428);
    writeValue(this,L"dataValue",pXVar6);
    break;
  case 0x22:
    writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LONG);
    sprintf(local_418,"%ld",*(undefined8 *)(obj + 8));
    pXVar6 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                (local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)aAStack_428);
    writeValue(this,L"dataValue",pXVar6);
    break;
  case 0x23:
    writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
    sprintf(local_418,"%d",(ulong)*(uint *)(obj + 8));
    pXVar6 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                (local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)aAStack_428);
    writeValue(this,L"dataValue",pXVar6);
    break;
  case 0x24:
    writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
    sprintf(local_418,"%d",(ulong)(uint)(int)*(short *)(obj + 8));
    pXVar6 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                (local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)aAStack_428);
    writeValue(this,L"dataValue",pXVar6);
    break;
  case 0x25:
    writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
    sprintf(local_418,"%d",(ulong)(uint)(int)(char)obj[8]);
    pXVar6 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                (local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)aAStack_428);
    writeValue(this,L"dataValue",pXVar6);
    break;
  case 0x26:
    writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_NONNEGATIVEINTEGER);
    sprintf(local_418,"%ld",*(undefined8 *)(obj + 8));
    pXVar6 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                (local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)aAStack_428);
    writeValue(this,L"dataValue",pXVar6);
    break;
  case 0x27:
    writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_ULONG);
    sprintf(local_418,"%lu",*(undefined8 *)(obj + 8));
    pXVar6 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                (local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)aAStack_428);
    writeValue(this,L"dataValue",pXVar6);
    break;
  case 0x28:
    writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    sprintf(local_418,"%u",(ulong)*(uint *)(obj + 8));
    pXVar6 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                (local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)aAStack_428);
    writeValue(this,L"dataValue",pXVar6);
    break;
  case 0x29:
    writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
    sprintf(local_418,"%u",(ulong)*(ushort *)(obj + 8));
    pXVar6 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                (local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)aAStack_428);
    writeValue(this,L"dataValue",pXVar6);
    break;
  case 0x2a:
    writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    sprintf(local_418,"%u",(ulong)(byte)obj[8]);
    pXVar6 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                (local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)aAStack_428);
    writeValue(this,L"dataValue",pXVar6);
    break;
  case 0x2b:
    writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
    sprintf(local_418,"%ld",*(undefined8 *)(obj + 8));
    pXVar6 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                (local_418,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)aAStack_428);
    writeValue(this,L"dataValue",pXVar6);
  }
  xercesc_4_0::ArrayJanitor<char16_t>::~ArrayJanitor(aAStack_428);
switchD_0010f52f_caseD_10:
  pXVar6 = this->fIndentChars;
  lVar5 = 0;
  if (pXVar6 != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)pXVar6 + lVar5);
      lVar5 = lVar5 + 2;
    } while (*psVar1 != 0);
    lVar5 = (lVar5 >> 1) + -1;
  }
  pXVar6[lVar5 + -1] = L'\0';
  this->fIndent = this->fIndent - 1;
  writeClose(this,L"actualValue");
  pwVar2 = this->fIndentChars;
  lVar5 = 0;
  if (pwVar2 != (wchar16 *)0x0) {
    do {
      psVar1 = (short *)((long)pwVar2 + lVar5);
      lVar5 = lVar5 + 2;
    } while (*psVar1 != 0);
    lVar5 = (lVar5 >> 1) + -1;
  }
  pwVar2[lVar5 + -1] = L'\0';
  this->fIndent = this->fIndent - 1;
  pXVar4 = this->fFormatter;
  *(undefined4 *)pXVar4 = 0;
  pXVar4 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar4,pwVar2);
  pXVar6 = L"-->\n";
  xercesc_4_0::XMLFormatter::operator<<(pXVar4,L"-->\n");
  xercesc_4_0::XSValue::~XSValue(obj);
  xercesc_4_0::XMemory::operator_delete((XMemory *)obj,pXVar6);
  return;
}

Assistant:

void  PSVIWriterHandlers::processActualValue(PSVIItem* item)
{
    if (!item) return;

    XSValue* obj = item->getActualValue();

    if (obj)
    {
        char buffer[1024];

        writeString(gCommentStart);
        incIndent();
        writeOpen(gActualValue);
        incIndent();

        switch (obj->fData.f_datatype)
        {
        case XSValue::dt_boolean:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_BOOLEAN);
                writeValue(gDataValue, XMLUni::fgBooleanValueSpace[obj->fData.fValue.f_bool? 0: 1]);
            }
            break;
        case XSValue::dt_decimal:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_DECIMAL);
                sprintf( buffer,"%f", obj->fData.fValue.f_decimal.f_dvalue);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_float:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_FLOAT);
                sprintf( buffer,"%f", obj->fData.fValue.f_float);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_double:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_DOUBLE);
                sprintf( buffer,"%f", obj->fData.fValue.f_double);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_duration:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_DURATION);
                formDateTime(obj);
            }
            break;
        case XSValue::dt_dateTime:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_DATETIME);
                formDateTime(obj);
            }
            break;
        case XSValue::dt_time:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_TIME);
                formDateTime(obj);
            }
            break;
        case XSValue::dt_date:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_DATE);
                formDateTime(obj);
            }
            break;
        case XSValue::dt_gYearMonth:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_YEARMONTH);
                formDateTime(obj);
            }
            break;
        case XSValue::dt_gYear:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_YEAR);
                formDateTime(obj);
            }
            break;
        case XSValue::dt_gMonthDay:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_MONTHDAY);
                formDateTime(obj);
            }
            break;
        case XSValue::dt_gDay:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_DAY);
                formDateTime(obj);
            }
            break;
        case XSValue::dt_gMonth:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_MONTH);
                formDateTime(obj);
            }
            break;
        case XSValue::dt_hexBinary:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_HEXBINARY);
                writeValue(gDataValue, obj->fData.fValue.f_strVal);
            }
            break;
        case XSValue::dt_base64Binary:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_BASE64BINARY);
                writeValue(gDataValue, obj->fData.fValue.f_strVal);
            }
            break;

        case XSValue::dt_integer:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_INTEGER);
                sprintf( buffer,"%ld", obj->fData.fValue.f_long);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_nonPositiveInteger:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_NONPOSITIVEINTEGER);
                sprintf( buffer,"%ld", obj->fData.fValue.f_long);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_negativeInteger:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_NEGATIVEINTEGER);
                sprintf( buffer,"%ld", obj->fData.fValue.f_long);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_long:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_LONG);
                sprintf( buffer,"%ld", obj->fData.fValue.f_long);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_int:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_INT);
                sprintf( buffer,"%d", obj->fData.fValue.f_int);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_short:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_SHORT);
                sprintf( buffer,"%d", obj->fData.fValue.f_short);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_byte:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_BYTE);
                sprintf( buffer,"%d", obj->fData.fValue.f_char);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_nonNegativeInteger:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_NONNEGATIVEINTEGER);
                sprintf( buffer,"%ld", obj->fData.fValue.f_long);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_unsignedLong:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_ULONG);
                sprintf( buffer,"%lu", obj->fData.fValue.f_ulong);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_unsignedInt:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_UINT);
                sprintf( buffer,"%u", obj->fData.fValue.f_uint);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_unsignedShort:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_USHORT);
                sprintf( buffer,"%u", obj->fData.fValue.f_ushort);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_unsignedByte:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_UBYTE);
                sprintf( buffer,"%u", obj->fData.fValue.f_uchar);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_positiveInteger:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_POSITIVEINTEGER);
                sprintf( buffer,"%ld", obj->fData.fValue.f_long);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_string:
        case XSValue::dt_anyURI:
        case XSValue::dt_QName:
        case XSValue::dt_NOTATION:
        case XSValue::dt_normalizedString:
        case XSValue::dt_token:
        case XSValue::dt_language:
        case XSValue::dt_NMTOKEN:
        case XSValue::dt_NMTOKENS:
        case XSValue::dt_Name:
        case XSValue::dt_NCName:
        case XSValue::dt_ID:
        case XSValue::dt_IDREF:
        case XSValue::dt_IDREFS:
        case XSValue::dt_ENTITY:
        case XSValue::dt_ENTITIES:
            break; //we shouldn't see them
        default:
            break;
        }

        decIndent();
        writeClose(gActualValue);
        decIndent();
        writeString(gCommentEnd);

    	delete obj;
 	}
}